

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<char,_false,_false>::grow_and_add
          (FastVector<char,_false,_false> *this,uint newSize,char *val)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *ptr;
  uint oldMax;
  char *oldData;
  char *val_local;
  uint newSize_local;
  FastVector<char,_false,_false> *this_local;
  
  ptr = this->data;
  uVar2 = this->max;
  grow_no_destroy(this,newSize);
  cVar1 = *val;
  uVar3 = this->count;
  this->count = uVar3 + 1;
  this->data[uVar3] = cVar1;
  if (ptr != (char *)0x0) {
    NULLC::destruct<char>(ptr,(ulong)uVar2);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}